

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O0

FT_Error T1_Get_MM_Var(T1_Face face,FT_MM_Var **master)

{
  FT_Memory memory_00;
  PS_Blend pPVar1;
  int iVar2;
  FT_Fixed FVar3;
  PS_Blend blend;
  FT_Fixed axiscoords [4];
  FT_UInt i;
  FT_Error error;
  FT_Multi_Master mmaster;
  FT_MM_Var *mmvar;
  FT_Memory memory;
  FT_MM_Var **master_local;
  T1_Face face_local;
  
  memory_00 = (face->root).memory;
  mmaster.axis[3].maximum = 0;
  pPVar1 = face->blend;
  axiscoords[3]._4_4_ = T1_Get_Multi_Master(face,(FT_Multi_Master *)&i);
  if (axiscoords[3]._4_4_ == 0) {
    mmaster.axis[3].maximum =
         (FT_Long)ft_mem_alloc(memory_00,(ulong)i * 0x30 + 0x20,
                               (FT_Error *)((long)axiscoords + 0x1c));
    if (axiscoords[3]._4_4_ == 0) {
      *(FT_UInt *)mmaster.axis[3].maximum = i;
      *(FT_Error *)(mmaster.axis[3].maximum + 4) = error;
      *(FT_UInt *)(mmaster.axis[3].maximum + 8) = 0;
      *(FT_UInt **)(mmaster.axis[3].maximum + 0x10) = (FT_UInt *)(mmaster.axis[3].maximum + 0x20);
      *(FT_UInt *)(mmaster.axis[3].maximum + 0x18) = 0;
      *(FT_UInt *)(mmaster.axis[3].maximum + 0x1c) = 0;
      for (axiscoords[3]._0_4_ = 0; (uint)axiscoords[3] < i;
          axiscoords[3]._0_4_ = (uint)axiscoords[3] + 1) {
        *(FT_Long *)(*(long *)(mmaster.axis[3].maximum + 0x10) + (ulong)(uint)axiscoords[3] * 0x30)
             = mmaster.axis[(ulong)(uint)axiscoords[3] - 1].maximum;
        *(long *)(*(long *)(mmaster.axis[3].maximum + 0x10) + (ulong)(uint)axiscoords[3] * 0x30 + 8)
             = (long)mmaster.axis[(uint)axiscoords[3]].name << 0x10;
        *(FT_Long *)
         (*(long *)(mmaster.axis[3].maximum + 0x10) + (ulong)(uint)axiscoords[3] * 0x30 + 0x18) =
             mmaster.axis[(uint)axiscoords[3]].minimum << 0x10;
        *(long *)(*(long *)(mmaster.axis[3].maximum + 0x10) + (ulong)(uint)axiscoords[3] * 0x30 +
                 0x10) =
             (*(long *)(*(long *)(mmaster.axis[3].maximum + 0x10) +
                        (ulong)(uint)axiscoords[3] * 0x30 + 8) +
             *(long *)(*(long *)(mmaster.axis[3].maximum + 0x10) + (ulong)(uint)axiscoords[3] * 0x30
                      + 0x18)) / 2;
        *(undefined4 *)
         (*(long *)(mmaster.axis[3].maximum + 0x10) + (ulong)(uint)axiscoords[3] * 0x30 + 0x28) =
             0xffffffff;
        *(undefined8 *)
         (*(long *)(mmaster.axis[3].maximum + 0x10) + (ulong)(uint)axiscoords[3] * 0x30 + 0x20) =
             0xffffffff;
        if (*(long *)(*(long *)(mmaster.axis[3].maximum + 0x10) + (ulong)(uint)axiscoords[3] * 0x30)
            != 0) {
          iVar2 = strcmp(*(char **)(*(long *)(mmaster.axis[3].maximum + 0x10) +
                                   (ulong)(uint)axiscoords[3] * 0x30),"Weight");
          if (iVar2 == 0) {
            *(undefined8 *)
             (*(long *)(mmaster.axis[3].maximum + 0x10) + (ulong)(uint)axiscoords[3] * 0x30 + 0x20)
                 = 0x77676874;
          }
          else {
            iVar2 = strcmp(*(char **)(*(long *)(mmaster.axis[3].maximum + 0x10) +
                                     (ulong)(uint)axiscoords[3] * 0x30),"Width");
            if (iVar2 == 0) {
              *(undefined8 *)
               (*(long *)(mmaster.axis[3].maximum + 0x10) + (ulong)(uint)axiscoords[3] * 0x30 + 0x20
               ) = 0x77647468;
            }
            else {
              iVar2 = strcmp(*(char **)(*(long *)(mmaster.axis[3].maximum + 0x10) +
                                       (ulong)(uint)axiscoords[3] * 0x30),"OpticalSize");
              if (iVar2 == 0) {
                *(undefined8 *)
                 (*(long *)(mmaster.axis[3].maximum + 0x10) + (ulong)(uint)axiscoords[3] * 0x30 +
                 0x20) = 0x6f70737a;
              }
            }
          }
        }
      }
      if (pPVar1->num_designs == 1 << ((byte)pPVar1->num_axis & 0x1f)) {
        mm_weights_unmap(pPVar1->default_weight_vector,(FT_Fixed *)&blend,pPVar1->num_axis);
        for (axiscoords[3]._0_4_ = 0; (uint)axiscoords[3] < i;
            axiscoords[3]._0_4_ = (uint)axiscoords[3] + 1) {
          FVar3 = mm_axis_unmap(pPVar1->design_map + (uint)axiscoords[3],
                                axiscoords[(ulong)(uint)axiscoords[3] - 1]);
          *(FT_Fixed *)
           (*(long *)(mmaster.axis[3].maximum + 0x10) + (ulong)(uint)axiscoords[3] * 0x30 + 0x10) =
               FVar3;
        }
      }
      *master = (FT_MM_Var *)mmaster.axis[3].maximum;
    }
  }
  return axiscoords[3]._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T1_Get_MM_Var( T1_Face      face,
                 FT_MM_Var*  *master )
  {
    FT_Memory        memory = face->root.memory;
    FT_MM_Var       *mmvar = NULL;
    FT_Multi_Master  mmaster;
    FT_Error         error;
    FT_UInt          i;
    FT_Fixed         axiscoords[T1_MAX_MM_AXIS];
    PS_Blend         blend = face->blend;


    error = T1_Get_Multi_Master( face, &mmaster );
    if ( error )
      goto Exit;
    if ( FT_ALLOC( mmvar,
                   sizeof ( FT_MM_Var ) +
                     mmaster.num_axis * sizeof ( FT_Var_Axis ) ) )
      goto Exit;

    mmvar->num_axis        = mmaster.num_axis;
    mmvar->num_designs     = mmaster.num_designs;
    mmvar->num_namedstyles = 0;                           /* Not supported */
    mmvar->axis            = (FT_Var_Axis*)&mmvar[1];
                                      /* Point to axes after MM_Var struct */
    mmvar->namedstyle      = NULL;

    for ( i = 0; i < mmaster.num_axis; i++ )
    {
      mmvar->axis[i].name    = mmaster.axis[i].name;
      mmvar->axis[i].minimum = INT_TO_FIXED( mmaster.axis[i].minimum );
      mmvar->axis[i].maximum = INT_TO_FIXED( mmaster.axis[i].maximum );
      mmvar->axis[i].def     = ( mmvar->axis[i].minimum +
                                   mmvar->axis[i].maximum ) / 2;
                            /* Does not apply.  But this value is in range */
      mmvar->axis[i].strid   = ~0U;                      /* Does not apply */
      mmvar->axis[i].tag     = ~0U;                      /* Does not apply */

      if ( !mmvar->axis[i].name )
        continue;

      if ( ft_strcmp( mmvar->axis[i].name, "Weight" ) == 0 )
        mmvar->axis[i].tag = FT_MAKE_TAG( 'w', 'g', 'h', 't' );
      else if ( ft_strcmp( mmvar->axis[i].name, "Width" ) == 0 )
        mmvar->axis[i].tag = FT_MAKE_TAG( 'w', 'd', 't', 'h' );
      else if ( ft_strcmp( mmvar->axis[i].name, "OpticalSize" ) == 0 )
        mmvar->axis[i].tag = FT_MAKE_TAG( 'o', 'p', 's', 'z' );
    }

    if ( blend->num_designs == ( 1U << blend->num_axis ) )
    {
      mm_weights_unmap( blend->default_weight_vector,
                        axiscoords,
                        blend->num_axis );

      for ( i = 0; i < mmaster.num_axis; i++ )
        mmvar->axis[i].def = mm_axis_unmap( &blend->design_map[i],
                                            axiscoords[i] );
    }

    *master = mmvar;

  Exit:
    return error;
  }